

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::UniformLocationTests::init(UniformLocationTests *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppSVar1;
  undefined4 uVar2;
  iterator iVar3;
  RenderContext *pRVar4;
  Context *pCVar5;
  undefined8 uVar6;
  UniformLocationTests *pUVar7;
  int ndx;
  uint uVar8;
  deUint32 dVar9;
  int iVar10;
  ShaderStage SVar11;
  ShaderStage SVar12;
  ShaderStage SVar13;
  ShaderStage SVar14;
  int extraout_EAX;
  TestNode *pTVar15;
  char *pcVar16;
  long *plVar17;
  UniformLocationCase *pUVar18;
  UniformLocationCase *pUVar19;
  StructType *pSVar20;
  undefined4 extraout_var;
  TestNode *pTVar21;
  TestContext *pTVar22;
  pointer *ppSVar23;
  long lVar24;
  ulong uVar25;
  int arraySize;
  ShaderStage SVar26;
  DataType DVar27;
  undefined8 *puVar28;
  bool bVar29;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  config;
  string name;
  Random rng;
  Random rng_1;
  UniformInfo uniform;
  Random rng_2;
  undefined1 local_388 [24];
  StructType *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  pointer local_358;
  long lStack_350;
  ulong local_348;
  UniformLocationTests *local_340;
  TestNode *local_338;
  undefined8 local_330;
  UniformLocationCase *local_328;
  TestNode *local_320;
  VarType local_318;
  ulong local_300;
  StructType *local_2f8 [3];
  ulong local_2e0;
  vector<glu::StructType*,std::allocator<glu::StructType*>> *local_2d8;
  long local_2d0;
  ShaderStage local_2c4;
  ShaderStage local_2c0;
  ShaderStage local_2bc;
  ShaderStage local_2b8;
  ShaderStage local_2b4;
  undefined1 local_2b0 [24];
  undefined8 uStack_298;
  ShaderStage local_290;
  uint local_28c;
  ios_base local_240 [264];
  TestNode *local_138;
  VarType local_130;
  VarType local_118;
  VarType local_100;
  VarType local_e8;
  VarType local_d0;
  VarType local_b8;
  VarType local_a0;
  VarType local_88;
  VarType local_70;
  deRandom local_58;
  VarType local_48;
  
  uVar8 = tcu::CommandLine::getBaseSeed
                    (((this->super_TestCaseGroup).m_context)->m_testCtx->m_cmdLine);
  pTVar15 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Location specified with use, single shader stage");
  local_2e0 = (ulong)uVar8;
  deRandom_init((deRandom *)&local_318,uVar8 + 0x1001);
  local_340 = this;
  tcu::TestNode::addChild((TestNode *)this,pTVar15);
  lVar24 = 0;
  do {
    pTVar21 = (TestNode *)(ulong)(uint)(&DAT_01ca50e0)[lVar24];
    local_320 = (TestNode *)CONCAT44(local_320._4_4_,((&DAT_01ca50e0)[lVar24] - 0x23 < 4) + 2);
    puVar28 = &DAT_021a5aa0;
    local_348 = 0;
    local_338 = pTVar21;
    local_328 = (UniformLocationCase *)lVar24;
    do {
      pcVar16 = glu::getDataTypeName((DataType)pTVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,pcVar16,(allocator<char> *)local_2f8);
      plVar17 = (long *)std::__cxx11::string::append(local_388);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pTVar22 = (TestContext *)(plVar17 + 2);
      if ((TestContext *)*plVar17 == pTVar22) {
        local_2b0._16_8_ = pTVar22->m_platform;
        uStack_298 = plVar17[3];
      }
      else {
        local_2b0._16_8_ = pTVar22->m_platform;
        local_2b0._0_8_ = (TestContext *)*plVar17;
      }
      local_2b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar17 + 1);
      *plVar17 = (long)pTVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append((char *)local_2b0);
      local_368._M_allocated_capacity = (size_type)&local_358;
      ppSVar23 = (pointer *)(plVar17 + 2);
      if ((pointer *)*plVar17 == ppSVar23) {
        local_358 = *ppSVar23;
        lStack_350 = plVar17[3];
      }
      else {
        local_358 = *ppSVar23;
        local_368._M_allocated_capacity = (size_type)(pointer *)*plVar17;
      }
      local_368._8_8_ = plVar17[1];
      *plVar17 = (long)ppSVar23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_388._0_8_ = (StructType *)0x0;
      local_388._8_8_ = (StructType *)0x0;
      local_388._16_8_ = (StructType *)0x0;
      glu::VarType::VarType(&local_70,(DataType)pTVar21,(Precision)local_320);
      SVar11 = *(ShaderStage *)(local_348 + 0x1b9f42c);
      local_330 = puVar28;
      dVar9 = deRandom_getUint32((deRandom *)&local_318);
      glu::VarType::VarType((VarType *)local_2b0,&local_70);
      local_28c = dVar9 & 0x3ff;
      uStack_298 = CONCAT44(SVar11,SVar11);
      local_290 = SVar11;
      glu::VarType::~VarType(&local_70);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_388,(value_type *)local_2b0);
      puVar28 = local_330;
      pTVar21 = local_338;
      pUVar18 = (UniformLocationCase *)operator_new(0x90);
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar18,(local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,((local_340->super_TestCaseGroup).m_context)->m_renderCtx,
                 (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_388);
      tcu::TestNode::addChild(pTVar15,(TestNode *)pUVar18);
      glu::VarType::~VarType((VarType *)local_2b0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_388);
      if ((pointer *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,
                        (ulong)((long)&(local_358->m_name)._M_dataplus._M_p + 1));
      }
      local_348 = local_348 + 4;
      puVar28 = puVar28 + 1;
    } while ((undefined1 *)local_348 == &DAT_00000004);
    lVar24 = (long)local_328 + 1;
  } while (lVar24 != 0x1c);
  pTVar15 = (TestNode *)operator_new(0x70);
  pUVar7 = local_340;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"array",
             "Array location specified with use, single shader stage");
  deRandom_init((deRandom *)local_2f8,(int)local_2e0 + 0x2001);
  tcu::TestNode::addChild((TestNode *)pUVar7,pTVar15);
  lVar24 = 0;
  do {
    local_338 = (TestNode *)(ulong)(uint)(&DAT_01ca50e0)[lVar24];
    local_320 = (TestNode *)CONCAT44(local_320._4_4_,((&DAT_01ca50e0)[lVar24] - 0x23 < 4) + 2);
    local_330 = &DAT_021a5aa0;
    local_348 = 0;
    local_328 = (UniformLocationCase *)lVar24;
    do {
      DVar27 = (DataType)local_338;
      pcVar16 = glu::getDataTypeName(DVar27);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,pcVar16,(allocator<char> *)&local_318);
      plVar17 = (long *)std::__cxx11::string::append(local_388);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pTVar22 = (TestContext *)(plVar17 + 2);
      if ((TestContext *)*plVar17 == pTVar22) {
        local_2b0._16_8_ = pTVar22->m_platform;
        uStack_298 = plVar17[3];
      }
      else {
        local_2b0._16_8_ = pTVar22->m_platform;
        local_2b0._0_8_ = (TestContext *)*plVar17;
      }
      local_2b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar17 + 1);
      *plVar17 = (long)pTVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append((char *)local_2b0);
      local_368._M_allocated_capacity = (size_type)&local_358;
      ppSVar23 = (pointer *)(plVar17 + 2);
      if ((pointer *)*plVar17 == ppSVar23) {
        local_358 = *ppSVar23;
        lStack_350 = plVar17[3];
      }
      else {
        local_358 = *ppSVar23;
        local_368._M_allocated_capacity = (size_type)(pointer *)*plVar17;
      }
      local_368._8_8_ = plVar17[1];
      *plVar17 = (long)ppSVar23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_388._0_8_ = (StructType *)0x0;
      local_388._8_8_ = (StructType *)0x0;
      local_388._16_8_ = (StructType *)0x0;
      glu::VarType::VarType(&local_318,DVar27,(Precision)local_320);
      glu::VarType::VarType(&local_48,&local_318,8);
      SVar11 = *(ShaderStage *)(local_348 + 0x1b9f42c);
      dVar9 = deRandom_getUint32((deRandom *)local_2f8);
      glu::VarType::VarType((VarType *)local_2b0,&local_48);
      local_28c = dVar9 % 0x3f8;
      uStack_298 = CONCAT44(SVar11,SVar11);
      local_290 = SVar11;
      glu::VarType::~VarType(&local_48);
      glu::VarType::~VarType(&local_318);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_388,(value_type *)local_2b0);
      pUVar18 = (UniformLocationCase *)operator_new(0x90);
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar18,(local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,((local_340->super_TestCaseGroup).m_context)->m_renderCtx,
                 (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_388);
      tcu::TestNode::addChild(pTVar15,(TestNode *)pUVar18);
      glu::VarType::~VarType((VarType *)local_2b0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_388);
      if ((pointer *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,
                        (ulong)((long)&(local_358->m_name)._M_dataplus._M_p + 1));
      }
      local_348 = local_348 + 4;
      local_330 = local_330 + 1;
    } while ((undefined1 *)local_348 == &DAT_00000004);
    lVar24 = (long)local_328 + 1;
  } while (lVar24 != 0x1c);
  pUVar18 = (UniformLocationCase *)operator_new(0x70);
  pUVar7 = local_340;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pUVar18,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "nested_array","Array location specified with use, single shader stage");
  deRandom_init(&local_58,(int)local_2e0 + 0x3001);
  tcu::TestNode::addChild((TestNode *)pUVar7,(TestNode *)pUVar18);
  uVar25 = 0;
  local_328 = pUVar18;
  do {
    DVar27 = (&DAT_01ca50e0)[uVar25];
    local_320 = (TestNode *)CONCAT44(local_320._4_4_,DVar27 - TYPE_SAMPLER_1D);
    local_338 = (TestNode *)CONCAT44(local_338._4_4_,(DVar27 - TYPE_BOOL < 4) + 2);
    puVar28 = &DAT_021a5aa0;
    local_348 = 0;
    local_300 = uVar25;
    do {
      pcVar16 = glu::getDataTypeName(DVar27);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,pcVar16,(allocator<char> *)&local_318);
      plVar17 = (long *)std::__cxx11::string::append(local_388);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pTVar22 = (TestContext *)(plVar17 + 2);
      if ((TestContext *)*plVar17 == pTVar22) {
        local_2b0._16_8_ = pTVar22->m_platform;
        uStack_298 = plVar17[3];
      }
      else {
        local_2b0._16_8_ = pTVar22->m_platform;
        local_2b0._0_8_ = (TestContext *)*plVar17;
      }
      local_2b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar17 + 1);
      *plVar17 = (long)pTVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append(local_2b0);
      local_368._M_allocated_capacity = (size_type)&local_358;
      ppSVar23 = (pointer *)(plVar17 + 2);
      if ((pointer *)*plVar17 == ppSVar23) {
        local_358 = *ppSVar23;
        lStack_350 = plVar17[3];
      }
      else {
        local_358 = *ppSVar23;
        local_368._M_allocated_capacity = (size_type)(pointer *)*plVar17;
      }
      local_368._8_8_ = plVar17[1];
      *plVar17 = (long)ppSVar23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      iVar10 = glu::getDataTypeScalarSize(DVar27);
      bVar29 = 0x1d < (Precision)local_320;
      local_388._0_8_ = (StructType *)0x0;
      local_388._8_8_ = (StructType *)0x0;
      local_388._16_8_ = (StructType *)0x0;
      glu::VarType::VarType((VarType *)local_2f8,DVar27,(Precision)local_338);
      arraySize = (uint)(iVar10 < 5 && bVar29) * 4 + 3;
      glu::VarType::VarType(&local_318,(VarType *)local_2f8,arraySize);
      glu::VarType::VarType(&local_88,&local_318,arraySize);
      SVar11 = *(ShaderStage *)(local_348 + 0x1b9f42c);
      local_330 = puVar28;
      dVar9 = deRandom_getUint32(&local_58);
      glu::VarType::VarType((VarType *)local_2b0,&local_88);
      local_28c = 0x3cf;
      if (iVar10 >= 5 || !bVar29) {
        local_28c = 0x3f7;
      }
      local_28c = dVar9 % local_28c;
      uStack_298 = CONCAT44(SVar11,SVar11);
      local_290 = SVar11;
      glu::VarType::~VarType(&local_88);
      glu::VarType::~VarType(&local_318);
      glu::VarType::~VarType((VarType *)local_2f8);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_388,(value_type *)local_2b0);
      pUVar18 = local_328;
      puVar28 = local_330;
      pUVar19 = (UniformLocationCase *)operator_new(0x90);
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar19,(local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,((local_340->super_TestCaseGroup).m_context)->m_renderCtx,
                 (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)local_388);
      tcu::TestNode::addChild((TestNode *)pUVar18,(TestNode *)pUVar19);
      glu::VarType::~VarType((VarType *)local_2b0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_388);
      if ((pointer *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,
                        (ulong)((long)&(local_358->m_name)._M_dataplus._M_p + 1));
      }
      local_348 = local_348 + 4;
      puVar28 = puVar28 + 1;
    } while ((undefined1 *)local_348 == &DAT_00000004);
    uVar25 = local_300 + 1;
  } while (uVar25 != 0x1c);
  pTVar15 = (TestNode *)operator_new(0x70);
  pUVar7 = local_340;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"struct",
             "Struct location, random contents & declaration location");
  deRandom_init((deRandom *)&local_318,(int)local_2e0 + 0x4001);
  local_320 = pTVar15;
  tcu::TestNode::addChild((TestNode *)pUVar7,pTVar15);
  local_2d8 = (vector<glu::StructType*,std::allocator<glu::StructType*>> *)&pUVar7->structTypes;
  iVar10 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    std::ostream::operator<<((value_type *)local_2b0,iVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    std::ios_base::~ios_base(local_240);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0x1c6e876);
    local_368._M_allocated_capacity = (size_type)&local_358;
    ppSVar23 = (pointer *)(plVar17 + 2);
    if ((pointer *)*plVar17 == ppSVar23) {
      local_358 = *ppSVar23;
      lStack_350 = plVar17[3];
    }
    else {
      local_358 = *ppSVar23;
      local_368._M_allocated_capacity = (size_type)(pointer *)*plVar17;
    }
    local_368._8_8_ = plVar17[1];
    *plVar17 = (long)ppSVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,
                      (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
    }
    dVar9 = deRandom_getUint32((deRandom *)&local_318);
    local_348 = CONCAT44(local_348._4_4_,dVar9);
    SVar11 = deRandom_getUint32((deRandom *)&local_318);
    SVar12 = deRandom_getUint32((deRandom *)&local_318);
    local_330 = (undefined8 *)
                (CONCAT44(local_330._4_4_,(ShaderStage)local_348) & 0xffffffff00000003);
    if ((local_348 & 3) == 0) {
      uVar8 = 0xffffffff;
    }
    else {
      dVar9 = deRandom_getUint32((deRandom *)&local_318);
      uVar8 = dVar9 % 0x3fb;
    }
    pSVar20 = (StructType *)operator_new(0x38);
    (pSVar20->m_typeName)._M_dataplus._M_p = (pointer)&(pSVar20->m_typeName).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pSVar20,"S","");
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3._M_current =
         (local_340->structTypes).
         super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_2f8[0] = pSVar20;
    if (iVar3._M_current ==
        (local_340->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar3,local_2f8);
    }
    else {
      *iVar3._M_current = pSVar20;
      pppSVar1 = &(local_340->structTypes).
                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    pSVar20 = local_2f8[0];
    dVar9 = deRandom_getUint32((deRandom *)&local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_2f8[0];
    dVar9 = deRandom_getUint32((deRandom *)&local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"b",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_2f8[0];
    dVar9 = deRandom_getUint32((deRandom *)&local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"c",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_2f8[0];
    dVar9 = deRandom_getUint32((deRandom *)&local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"d",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_2f8[0];
    dVar9 = deRandom_getUint32((deRandom *)&local_318);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember(pSVar20,"e",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    local_388._0_8_ = (StructType *)0x0;
    local_388._8_8_ = (StructType *)0x0;
    local_388._16_8_ = (StructType *)0x0;
    glu::VarType::VarType(&local_a0,local_2f8[0]);
    glu::VarType::VarType((VarType *)local_2b0,&local_a0);
    local_290 = SVar12 & (SVar11 | (ShaderStage)local_348) & SHADERSTAGE_BOTH;
    uStack_298 = CONCAT44((uint)local_330,SVar11 | (ShaderStage)local_348) & 0xffffffff00000003;
    local_28c = uVar8;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)local_388,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_a0);
    pUVar18 = (UniformLocationCase *)operator_new(0x90);
    Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar18,(local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_340->super_TestCaseGroup).m_context)->m_renderCtx,
               (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)local_388);
    tcu::TestNode::addChild(local_320,(TestNode *)pUVar18);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)local_388);
    if ((pointer *)local_368._M_allocated_capacity != &local_358) {
      operator_delete((void *)local_368._M_allocated_capacity,
                      (ulong)((long)&(local_358->m_name)._M_dataplus._M_p + 1));
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x10);
  pTVar15 = (TestNode *)operator_new(0x70);
  pUVar7 = local_340;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "nested_struct","Struct location specified with use, single shader stage");
  deRandom_init((deRandom *)local_2f8,(int)local_2e0 + 0x5001);
  local_138 = pTVar15;
  tcu::TestNode::addChild((TestNode *)pUVar7,pTVar15);
  local_330 = (undefined8 *)0x0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    std::ostream::operator<<((value_type *)local_2b0,(int)local_330);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    std::ios_base::~ios_base(local_240);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0x1c6e876);
    local_368._M_allocated_capacity = (size_type)&local_358;
    ppSVar23 = (pointer *)(plVar17 + 2);
    if ((pointer *)*plVar17 == ppSVar23) {
      local_358 = *ppSVar23;
      lStack_350 = plVar17[3];
    }
    else {
      local_358 = *ppSVar23;
      local_368._M_allocated_capacity = (size_type)(pointer *)*plVar17;
    }
    local_368._8_8_ = plVar17[1];
    *plVar17 = (long)ppSVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,
                      (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
    }
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    local_348 = CONCAT44(extraout_var,dVar9);
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    local_328 = (UniformLocationCase *)CONCAT44(local_328._4_4_,dVar9);
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    local_320 = (TestNode *)CONCAT44(local_320._4_4_,dVar9);
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    local_300 = CONCAT44(local_300._4_4_,dVar9);
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    local_338 = (TestNode *)CONCAT44(local_338._4_4_,dVar9);
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    local_2d0 = CONCAT44(local_2d0._4_4_,dVar9);
    SVar11 = deRandom_getUint32((deRandom *)local_2f8);
    SVar12 = deRandom_getUint32((deRandom *)local_2f8);
    local_2b4 = deRandom_getUint32((deRandom *)local_2f8);
    local_2b8 = deRandom_getUint32((deRandom *)local_2f8);
    local_2bc = deRandom_getUint32((deRandom *)local_2f8);
    local_2c0 = deRandom_getUint32((deRandom *)local_2f8);
    SVar13 = deRandom_getUint32((deRandom *)local_2f8);
    pSVar20 = (StructType *)operator_new(0x38);
    (pSVar20->m_typeName)._M_dataplus._M_p = (pointer)&(pSVar20->m_typeName).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pSVar20,"Type0","");
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388._0_8_ = pSVar20;
    pSVar20 = (StructType *)operator_new(0x38);
    (pSVar20->m_typeName)._M_dataplus._M_p = (pointer)&(pSVar20->m_typeName).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pSVar20,"Type1","");
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388._8_8_ = pSVar20;
    pSVar20 = (StructType *)operator_new(0x38);
    (pSVar20->m_typeName)._M_dataplus._M_p = (pointer)&(pSVar20->m_typeName).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pSVar20,"Type2","");
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388._16_8_ = pSVar20;
    pSVar20 = (StructType *)operator_new(0x38);
    (pSVar20->m_typeName)._M_dataplus._M_p = (pointer)&(pSVar20->m_typeName).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)pSVar20,"Type3","");
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar20->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3._M_current =
         (local_340->structTypes).
         super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_370 = pSVar20;
    if (iVar3._M_current ==
        (local_340->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar3,(StructType **)local_388);
    }
    else {
      *iVar3._M_current = (StructType *)local_388._0_8_;
      pppSVar1 = &(local_340->structTypes).
                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    iVar3._M_current =
         (local_340->structTypes).
         super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (local_340->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar3,(StructType **)(local_388 + 8));
    }
    else {
      *iVar3._M_current = (StructType *)local_388._8_8_;
      pppSVar1 = &(local_340->structTypes).
                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    iVar3._M_current =
         (local_340->structTypes).
         super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (local_340->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar3,(StructType **)(local_388 + 0x10));
    }
    else {
      *iVar3._M_current = (StructType *)local_388._16_8_;
      pppSVar1 = &(local_340->structTypes).
                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    iVar3._M_current =
         (local_340->structTypes).
         super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (local_340->structTypes).
        super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::StructType*,std::allocator<glu::StructType*>>::
      _M_realloc_insert<glu::StructType*const&>(local_2d8,iVar3,&local_370);
    }
    else {
      *iVar3._M_current = local_370;
      pppSVar1 = &(local_340->structTypes).
                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    uVar6 = local_388._0_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._0_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"b",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._0_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"c",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._0_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"d",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._0_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"e",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._8_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._8_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"b",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._8_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"c",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._8_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"d",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._8_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"e",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._16_8_;
    glu::VarType::VarType((VarType *)local_2b0,(StructType *)local_388._0_8_);
    glu::StructType::addMember((StructType *)uVar6,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._16_8_;
    glu::VarType::VarType((VarType *)local_2b0,(StructType *)local_388._8_8_);
    glu::StructType::addMember((StructType *)uVar6,"b",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    uVar6 = local_388._16_8_;
    dVar9 = deRandom_getUint32((deRandom *)local_2f8);
    glu::VarType::VarType
              ((VarType *)local_2b0,(&DAT_01ca50e0)[dVar9 % 0x19],
               ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
    glu::StructType::addMember((StructType *)uVar6,"c",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    pSVar20 = local_370;
    glu::VarType::VarType((VarType *)local_2b0,(StructType *)local_388._16_8_);
    glu::StructType::addMember(pSVar20,"a",(VarType *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    local_318.m_type = TYPE_BASIC;
    local_318._4_4_ = 0;
    local_318.m_data.array.elementType = (VarType *)0x0;
    local_318.m_data._8_8_ = 0;
    glu::VarType::VarType(&local_b8,(StructType *)local_388._0_8_);
    local_2c4 = SVar13;
    glu::VarType::VarType((VarType *)local_2b0,&local_b8);
    uVar25 = local_300;
    local_28c = (int)local_348 + (int)((local_348 & 0xffffffff) / 0x3c4) * -0x3c4;
    local_348 = (ulong)local_28c;
    SVar11 = SVar11 | (Precision)local_320;
    SVar13 = (Precision)local_300;
    SVar14 = local_2b4 | (Precision)local_338;
    SVar12 = SVar12 | (Precision)local_300 | SVar14;
    SVar26 = (ShaderStage)local_2d0 | (ShaderStage)local_328 | SVar11 | SVar12;
    local_290 = local_2b8 & SVar26 & SHADERSTAGE_BOTH;
    local_28c = -(uint)(((ulong)local_328 & 3) == 0) | local_28c;
    uStack_298 = CONCAT44((ShaderStage)local_328,SVar26) & 0x300000003;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&local_318,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_b8);
    glu::VarType::VarType(&local_d0,(StructType *)local_388._8_8_);
    glu::VarType::VarType((VarType *)local_2b0,&local_d0);
    SVar11 = SVar11 | SVar12;
    local_290 = local_2bc & SVar11 & SHADERSTAGE_BOTH;
    local_28c = -(uint)(((ulong)local_320 & 3) == 0) | (int)local_348 + 5U;
    uStack_298 = CONCAT44((Precision)local_320,SVar11) & 0x300000003;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&local_318,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_d0);
    glu::VarType::VarType(&local_e8,(StructType *)local_388._16_8_);
    glu::VarType::VarType((VarType *)local_2b0,&local_e8);
    local_290 = local_2c0 & SVar12 & SHADERSTAGE_BOTH;
    local_28c = -(uint)((uVar25 & 3) == 0) | (int)local_348 + 0x10U;
    uStack_298 = CONCAT44(SVar13,SVar12) & 0x300000003;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&local_318,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_e8);
    glu::VarType::VarType(&local_100,local_370);
    glu::VarType::VarType((VarType *)local_2b0,&local_100);
    local_290 = local_2c4 & SVar14 & SHADERSTAGE_BOTH;
    local_28c = -(uint)(((ulong)local_338 & 3) == 0) | (int)local_348 + 0x1bU;
    uStack_298 = CONCAT44((Precision)local_338,SVar14) & 0x300000003;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&local_318,(value_type *)local_2b0);
    glu::VarType::~VarType((VarType *)local_2b0);
    glu::VarType::~VarType(&local_100);
    pUVar18 = (UniformLocationCase *)operator_new(0x90);
    Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar18,(local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_340->super_TestCaseGroup).m_context)->m_renderCtx,
               (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)&local_318);
    tcu::TestNode::addChild(local_138,(TestNode *)pUVar18);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)&local_318);
    if ((pointer *)local_368._M_allocated_capacity != &local_358) {
      operator_delete((void *)local_368._M_allocated_capacity,
                      (ulong)((long)&(local_358->m_name)._M_dataplus._M_p + 1));
    }
    uVar8 = (int)local_330 + 1;
    local_330 = (undefined8 *)(ulong)uVar8;
  } while (uVar8 != 0x10);
  pTVar15 = (TestNode *)operator_new(0x70);
  pUVar7 = local_340;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_max"
             ,"Maximum & minimum location");
  tcu::TestNode::addChild((TestNode *)pUVar7,pTVar15);
  lVar24 = 0;
  local_338 = pTVar15;
  do {
    local_330 = (undefined8 *)(ulong)(uint)(&DAT_01ca50e0)[lVar24];
    local_300 = CONCAT44(local_300._4_4_,((&DAT_01ca50e0)[lVar24] - 0x23 < 4) + 2);
    local_320 = (TestNode *)&DAT_021a5aa0;
    local_348 = 0;
    local_2d0 = lVar24;
    do {
      pcVar16 = glu::getDataTypeName((DataType)local_330);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,pcVar16,(allocator<char> *)&local_318);
      plVar17 = (long *)std::__cxx11::string::append(local_388);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pTVar22 = (TestContext *)(plVar17 + 2);
      if ((TestContext *)*plVar17 == pTVar22) {
        local_2b0._16_8_ = pTVar22->m_platform;
        uStack_298 = plVar17[3];
      }
      else {
        local_2b0._16_8_ = pTVar22->m_platform;
        local_2b0._0_8_ = (TestContext *)*plVar17;
      }
      local_2b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar17 + 1);
      *plVar17 = (long)pTVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append((char *)local_2b0);
      local_368._M_allocated_capacity = (size_type)&local_358;
      ppSVar23 = (pointer *)(plVar17 + 2);
      if ((pointer *)*plVar17 == ppSVar23) {
        local_358 = *ppSVar23;
        lStack_350 = plVar17[3];
      }
      else {
        local_358 = *ppSVar23;
        local_368._M_allocated_capacity = (size_type)(pointer *)*plVar17;
      }
      local_368._8_8_ = plVar17[1];
      *plVar17 = (long)ppSVar23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_318.m_type = TYPE_BASIC;
      local_318._4_4_ = 0;
      local_318.m_data.array.elementType = (VarType *)0x0;
      local_318.m_data._8_8_ = 0;
      glu::VarType::VarType(&local_130,(DataType)local_330,(Precision)local_300);
      SVar11 = *(ShaderStage *)(local_348 + 0x1b9f42c);
      glu::VarType::VarType((VarType *)local_2b0,&local_130);
      uStack_298 = CONCAT44(SVar11,SVar11);
      local_28c = 0;
      local_290 = SVar11;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)&local_318,(value_type *)local_2b0);
      glu::VarType::~VarType((VarType *)local_2b0);
      glu::VarType::~VarType(&local_130);
      pUVar18 = (UniformLocationCase *)operator_new(0x90);
      pTVar22 = (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar4 = ((local_340->super_TestCaseGroup).m_context)->m_renderCtx;
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b0,local_368._M_allocated_capacity,
                 local_368._8_8_ + local_368._M_allocated_capacity);
      std::__cxx11::string::append((char *)local_2b0);
      uVar6 = local_2b0._0_8_;
      local_388._0_8_ = local_388 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_368._M_allocated_capacity,
                 local_368._8_8_ + local_368._M_allocated_capacity);
      std::__cxx11::string::append(local_388);
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (pUVar18,pTVar22,pRVar4,(char *)uVar6,(char *)local_388._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)&local_318);
      tcu::TestNode::addChild(local_338,(TestNode *)pUVar18);
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      local_328 = (UniformLocationCase *)operator_new(0x90);
      pTVar22 = (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar4 = ((local_340->super_TestCaseGroup).m_context)->m_renderCtx;
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b0,local_368._M_allocated_capacity,
                 local_368._8_8_ + local_368._M_allocated_capacity);
      std::__cxx11::string::append((char *)local_2b0);
      uVar6 = local_2b0._0_8_;
      local_388._0_8_ = local_388 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_368._M_allocated_capacity,
                 local_368._8_8_ + local_368._M_allocated_capacity);
      std::__cxx11::string::append(local_388);
      pUVar18 = local_328;
      Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
                (local_328,pTVar22,pRVar4,(char *)uVar6,(char *)local_388._0_8_,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  *)&local_318);
      (pUVar18->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__UniformLocationCase_021a5b28;
      tcu::TestNode::addChild(local_338,(TestNode *)pUVar18);
      if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
      }
      if ((TestContext *)local_2b0._0_8_ != (TestContext *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 *)&local_318);
      if ((pointer *)local_368._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_368._M_allocated_capacity,
                        (ulong)((long)&(local_358->m_name)._M_dataplus._M_p + 1));
      }
      local_348 = local_348 + 4;
      local_320 = (TestNode *)((long)local_320 + 8);
    } while ((undefined1 *)local_348 == &DAT_00000004);
    lVar24 = local_2d0 + 1;
  } while (lVar24 != 0x1c);
  pTVar15 = (TestNode *)operator_new(0x70);
  pUVar7 = local_340;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"link",
             "Location specified independently from use");
  deRandom_init((deRandom *)&local_318,(int)local_2e0 + 0x82e1);
  tcu::TestNode::addChild((TestNode *)pUVar7,pTVar15);
  local_300 = 0;
  local_328 = (UniformLocationCase *)pTVar15;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    std::ostream::operator<<((value_type *)local_2b0,(int)local_300);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    std::ios_base::~ios_base(local_240);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0x1c6e876);
    local_368._M_allocated_capacity = (size_type)&local_358;
    ppSVar23 = (pointer *)(plVar17 + 2);
    if ((pointer *)*plVar17 == ppSVar23) {
      local_358 = *ppSVar23;
      lStack_350 = plVar17[3];
    }
    else {
      local_358 = *ppSVar23;
      local_368._M_allocated_capacity = (size_type)(pointer *)*plVar17;
    }
    local_368._8_8_ = plVar17[1];
    *plVar17 = (long)ppSVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((StructType *)local_388._0_8_ != (StructType *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,
                      (ulong)((long)&(((string *)local_388._16_8_)->_M_dataplus)._M_p + 1));
    }
    local_388._0_8_ = (StructType *)0x0;
    local_388._8_8_ = (StructType *)0x0;
    local_388._16_8_ = (StructType *)0x0;
    local_338 = (TestNode *)operator_new(0x1000);
    iVar10 = (Precision)local_300 * 100;
    memset(local_338,0,0x1000);
    deRandom_init((deRandom *)local_2b0,iVar10 + 0x1234);
    lVar24 = 0;
    do {
      *(int *)((long)&local_338->_vptr_TestNode + lVar24 * 4) = (int)lVar24;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x400);
    uVar25 = 0x400;
    do {
      dVar9 = deRandom_getUint32((deRandom *)local_2b0);
      lVar24 = (long)(int)((ulong)dVar9 % (uVar25 & 0xffffffff));
      uVar2 = *(undefined4 *)((long)local_338 + uVar25 * 4 + -4);
      *(undefined4 *)((long)local_338 + uVar25 * 4 + -4) =
           *(undefined4 *)((long)&local_338->_vptr_TestNode + lVar24 * 4);
      *(undefined4 *)((long)&local_338->_vptr_TestNode + lVar24 * 4) = uVar2;
      uVar25 = uVar25 - 1;
    } while (1 < uVar25);
    local_320 = (TestNode *)((long)&local_338[0x24].m_description._M_string_length + 4);
    iVar10 = 0x20;
    do {
      local_348 = CONCAT44(local_348._4_4_,iVar10);
      SVar11 = deRandom_getUint32((deRandom *)&local_318);
      SVar12 = deRandom_getUint32((deRandom *)&local_318);
      SVar13 = deRandom_getUint32((deRandom *)&local_318);
      dVar9 = deRandom_getUint32((deRandom *)&local_318);
      glu::VarType::VarType
                (&local_118,(&DAT_01ca50e0)[dVar9 % 0x19],
                 ((&DAT_01ca50e0)[dVar9 % 0x19] - TYPE_BOOL < 4) + PRECISION_HIGHP);
      if ((SVar11 & SHADERSTAGE_BOTH) == SHADERSTAGE_NONE) {
        local_330 = (undefined8 *)CONCAT44(local_330._4_4_,0xffffffff);
      }
      else {
        local_330 = (undefined8 *)CONCAT44(local_330._4_4_,*(undefined4 *)local_320);
      }
      glu::VarType::VarType((VarType *)local_2b0,&local_118);
      local_290 = SVar13 & (SVar12 | SVar11) & SHADERSTAGE_BOTH;
      uStack_298 = CONCAT44(SVar11,SVar12 | SVar11) & 0x300000003;
      local_28c = (uint)local_330;
      glu::VarType::~VarType(&local_118);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                   *)local_388,(value_type *)local_2b0);
      iVar10 = (ShaderStage)local_348;
      glu::VarType::~VarType((VarType *)local_2b0);
      pUVar18 = local_328;
      local_320 = (TestNode *)((long)local_320 + -4);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    pUVar19 = (UniformLocationCase *)operator_new(0x90);
    Functional::anon_unknown_0::UniformLocationCase::UniformLocationCase
              (pUVar19,(local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_340->super_TestCaseGroup).m_context)->m_renderCtx,
               (char *)local_368._M_allocated_capacity,(char *)local_368._0_8_,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                *)local_388);
    tcu::TestNode::addChild((TestNode *)pUVar18,(TestNode *)pUVar19);
    operator_delete(local_338,0x1000);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
               *)local_388);
    if ((pointer *)local_368._M_allocated_capacity != &local_358) {
      operator_delete((void *)local_368._M_allocated_capacity,
                      (ulong)((long)&(local_358->m_name)._M_dataplus._M_p + 1));
    }
    uVar8 = (int)local_300 + 1;
    local_300 = (ulong)uVar8;
  } while (uVar8 != 10);
  pTVar15 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "negative","Negative tests");
  pTVar21 = (TestNode *)operator_new(0x70);
  pUVar7 = local_340;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar21,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es31",
             "GLSL ES 3.1 Negative tests");
  pCVar5 = (pUVar7->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)local_2b0,
             (pUVar7->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar5->m_renderCtx,pCVar5->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_368,
             (ShaderLibrary *)local_2b0,"shaders/es31/uniform_location.test");
  if (0 < (int)((ulong)(local_368._8_8_ - local_368._0_8_) >> 3)) {
    lVar24 = 0;
    do {
      tcu::TestNode::addChild(pTVar21,*(TestNode **)(local_368._M_allocated_capacity + lVar24 * 8));
      lVar24 = lVar24 + 1;
    } while (lVar24 < (int)((ulong)(local_368._8_8_ - local_368._0_8_) >> 3));
  }
  tcu::TestNode::addChild(pTVar15,pTVar21);
  if ((pointer *)local_368._M_allocated_capacity != (pointer *)0x0) {
    operator_delete((void *)local_368._M_allocated_capacity,(long)local_358 - local_368._0_8_);
  }
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)local_2b0);
  pTVar21 = (TestNode *)operator_new(0x70);
  pUVar7 = local_340;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar21,
             (local_340->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es32",
             "GLSL ES 3.2 Negative tests");
  pCVar5 = (pUVar7->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)local_2b0,
             (pUVar7->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar5->m_renderCtx,pCVar5->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_368,
             (ShaderLibrary *)local_2b0,"shaders/es32/uniform_location.test");
  if (0 < (int)((ulong)(local_368._8_8_ - local_368._0_8_) >> 3)) {
    lVar24 = 0;
    do {
      tcu::TestNode::addChild(pTVar21,*(TestNode **)(local_368._M_allocated_capacity + lVar24 * 8));
      lVar24 = lVar24 + 1;
    } while (lVar24 < (int)((ulong)(local_368._8_8_ - local_368._0_8_) >> 3));
  }
  tcu::TestNode::addChild(pTVar15,pTVar21);
  if ((pointer *)local_368._M_allocated_capacity != (pointer *)0x0) {
    operator_delete((void *)local_368._M_allocated_capacity,(long)local_358 - local_368._0_8_);
  }
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)local_2b0);
  tcu::TestNode::addChild((TestNode *)local_340,pTVar15);
  return extraout_EAX;
}

Assistant:

void UniformLocationTests::init (void)
{
	using namespace glu;

	const UniformInfo::ShaderStage checkStages[]	= { UniformInfo::SHADERSTAGE_VERTEX, UniformInfo::SHADERSTAGE_FRAGMENT };
	const char*						stageNames[]	= {"vertex", "fragment"};
	const int						maxLocations	= 1024;
	const int						baseSeed		= m_context.getTestContext().getCommandLine().getBaseSeed();

	const DataType					primitiveTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4,

		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4,

		TYPE_UINT,
		TYPE_UINT_VEC2,
		TYPE_UINT_VEC3,
		TYPE_UINT_VEC4,

		TYPE_BOOL,
		TYPE_BOOL_VEC2,
		TYPE_BOOL_VEC3,
		TYPE_BOOL_VEC4,

		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4,

		TYPE_SAMPLER_2D,
		TYPE_INT_SAMPLER_2D,
		TYPE_UINT_SAMPLER_2D,
	};

	const int maxPrimitiveTypeNdx = DE_LENGTH_OF_ARRAY(primitiveTypes) - 4;
	DE_ASSERT(primitiveTypes[maxPrimitiveTypeNdx] == TYPE_FLOAT_MAT4);

	// Primitive type cases with trivial linkage
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "basic", "Location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x1001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];

				vector<UniformInfo> config;

				UniformInfo			uniform	(createVarType(type),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 rng.getInt(0, maxLocations-1));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Arrays
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "array", "Array location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x2001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{

				const string		name	= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];

				vector<UniformInfo> config;

				UniformInfo			uniform	(VarType(createVarType(type), 8),
												checkStages[stageNdx],
												checkStages[stageNdx],
												checkStages[stageNdx],
												rng.getInt(0, maxLocations-1-8));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Nested Arrays
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "nested_array", "Array location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x3001);
		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];
				// stay comfortably within minimum max uniform component count (896 in fragment) and sampler count with all types
				const int			arraySize	= (getDataTypeScalarSize(type) > 4 || isDataTypeSampler(type)) ? 3 : 7;

				vector<UniformInfo> config;

				UniformInfo			uniform	(VarType(VarType(createVarType(type), arraySize), arraySize),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 rng.getInt(0, maxLocations-1-arraySize*arraySize));

				config.push_back(uniform);
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Structs
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "struct", "Struct location, random contents & declaration location");
		de::Random					rng		(baseSeed + 0x4001);
		addChild(group);

		for (int caseNdx = 0; caseNdx < 16; caseNdx++)
		{
			typedef UniformInfo::ShaderStage Stage;

			const string	name		= "case_" + de::toString(caseNdx);

			const Stage		layoutLoc	= Stage(rng.getUint32()&0x3);
			const Stage		declareLoc	= Stage((rng.getUint32()&0x3) | layoutLoc);
			const Stage		verifyLoc	= Stage((rng.getUint32()&0x3) & declareLoc);
			const int		location	= layoutLoc ? rng.getInt(0, maxLocations-1-5) : -1;

			StructType*		structProto = new StructType("S");

			structTypes.push_back(structProto);

			structProto->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			structProto->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			{
				vector<UniformInfo> config;

				config.push_back(UniformInfo(VarType(structProto),
											 declareLoc,
											 layoutLoc,
											 verifyLoc,
											 location));
				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Nested Structs
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "nested_struct", "Struct location specified with use, single shader stage");
		de::Random					rng		(baseSeed + 0x5001);

		addChild(group);

		for (int caseNdx = 0; caseNdx < 16; caseNdx++)
		{
			typedef UniformInfo::ShaderStage Stage;

			const string	name		= "case_" + de::toString(caseNdx);
			const int		baseLoc		= rng.getInt(0, maxLocations-1-60);

			// Structs need to be added in the order of their declaration
			const Stage		layoutLocs[]=
			{
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
				Stage(rng.getUint32()&0x3),
			};

			const deUint32	tempDecl[] =
			{
				(rng.getUint32()&0x3) | layoutLocs[0],
				(rng.getUint32()&0x3) | layoutLocs[1],
				(rng.getUint32()&0x3) | layoutLocs[2],
				(rng.getUint32()&0x3) | layoutLocs[3],
			};

			// Component structs need to be declared if anything using them is declared
			const Stage		declareLocs[] =
			{
				Stage(tempDecl[0] | tempDecl[1] | tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[1] | tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[2] | tempDecl[3]),
				Stage(tempDecl[3]),
			};

			const Stage		verifyLocs[] =
			{
				Stage(rng.getUint32()&0x3 & declareLocs[0]),
				Stage(rng.getUint32()&0x3 & declareLocs[1]),
				Stage(rng.getUint32()&0x3 & declareLocs[2]),
				Stage(rng.getUint32()&0x3 & declareLocs[3]),
			};

			StructType*		testTypes[]	=
			{
				new StructType("Type0"),
				new StructType("Type1"),
				new StructType("Type2"),
				new StructType("Type3"),
			};

			structTypes.push_back(testTypes[0]);
			structTypes.push_back(testTypes[1]);
			structTypes.push_back(testTypes[2]);
			structTypes.push_back(testTypes[3]);

			testTypes[0]->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[0]->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[1]->addMember("a", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("b", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("d", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));
			testTypes[1]->addMember("e", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[2]->addMember("a", VarType(testTypes[0]));
			testTypes[2]->addMember("b", VarType(testTypes[1]));
			testTypes[2]->addMember("c", createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]));

			testTypes[3]->addMember("a", VarType(testTypes[2]));

			{
				vector<UniformInfo> config;

				config.push_back(UniformInfo(VarType(testTypes[0]),
											 declareLocs[0],
											 layoutLocs[0],
											 verifyLocs[0],
											 layoutLocs[0] ? baseLoc : -1));

				config.push_back(UniformInfo(VarType(testTypes[1]),
											 declareLocs[1],
											 layoutLocs[1],
											 verifyLocs[1],
											 layoutLocs[1] ? baseLoc+5 : -1));

				config.push_back(UniformInfo(VarType(testTypes[2]),
											 declareLocs[2],
											 layoutLocs[2],
											 verifyLocs[2],
											 layoutLocs[2] ? baseLoc+16 : -1));

				config.push_back(UniformInfo(VarType(testTypes[3]),
											 declareLocs[3],
											 layoutLocs[3],
											 verifyLocs[3],
											 layoutLocs[3] ? baseLoc+27 : -1));

				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
			}
		}
	}

	// Min/Max location
	{
		tcu::TestCaseGroup* const	group		= new tcu::TestCaseGroup(m_testCtx, "min_max", "Maximum & minimum location");

		addChild(group);

		for (int primitiveNdx = 0; primitiveNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveNdx++)
		{
			const DataType		type	= primitiveTypes[primitiveNdx];

			for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(checkStages); stageNdx++)
			{
				const string		name		= string(getDataTypeName(type)) + "_" + stageNames[stageNdx];
				vector<UniformInfo> config;

				config.push_back(UniformInfo(createVarType(type),
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 checkStages[stageNdx],
											 0));

				group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), (name+"_min").c_str(), (name+"_min").c_str(), config));

				group->addChild(new MaxUniformLocationCase (m_testCtx, m_context.getRenderContext(), (name+"_max").c_str(), (name+"_max").c_str(), config));
			}
		}
	}

	// Link
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, "link", "Location specified independently from use");
		de::Random					rng		(baseSeed + 0x82e1);

		addChild(group);

		for (int caseNdx = 0; caseNdx < 10; caseNdx++)
		{
			const string		name		= "case_" + de::toString(caseNdx);
			vector<UniformInfo> config;

			vector<int>			locations	= shuffledRange(0, maxLocations, 0x1234 + caseNdx*100);

			for (int count = 0; count < 32; count++)
			{
				typedef UniformInfo::ShaderStage Stage;

				const Stage			layoutLoc	= Stage(rng.getUint32()&0x3);
				const Stage			declareLoc	= Stage((rng.getUint32()&0x3) | layoutLoc);
				const Stage			verifyLoc	= Stage((rng.getUint32()&0x3) & declareLoc);

				const UniformInfo	uniform		(createVarType(primitiveTypes[rng.getInt(0, maxPrimitiveTypeNdx)]),
												 declareLoc,
												 layoutLoc,
												 verifyLoc,
												 (layoutLoc!=0) ? locations.back() : -1);

				config.push_back(uniform);
				locations.pop_back();
			}
			group->addChild(new UniformLocationCase (m_testCtx, m_context.getRenderContext(), name.c_str(), name.c_str(), config));
		}
	}

	// Negative
	{
		de::MovePtr<tcu::TestCaseGroup>	negativeGroup			(new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests"));

		{
			de::MovePtr<tcu::TestCaseGroup>	es31Group		(new tcu::TestCaseGroup(m_testCtx, "es31", "GLSL ES 3.1 Negative tests"));
			gls::ShaderLibrary				shaderLibrary   (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
			const vector<TestNode*>			negativeCases    = shaderLibrary.loadShaderFile("shaders/es31/uniform_location.test");

			for (int ndx = 0; ndx < int(negativeCases.size()); ndx++)
				es31Group->addChild(negativeCases[ndx]);

			negativeGroup->addChild(es31Group.release());
		}

		{
			de::MovePtr<tcu::TestCaseGroup>	es32Group		(new tcu::TestCaseGroup(m_testCtx, "es32", "GLSL ES 3.2 Negative tests"));
			gls::ShaderLibrary				shaderLibrary   (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
			const vector<TestNode*>			negativeCases    = shaderLibrary.loadShaderFile("shaders/es32/uniform_location.test");

			for (int ndx = 0; ndx < int(negativeCases.size()); ndx++)
				es32Group->addChild(negativeCases[ndx]);

			negativeGroup->addChild(es32Group.release());
		}

		addChild(negativeGroup.release());
	}
}